

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O3

Vec_Wrd_t * Abc_NtkShareSuperXor(Abc_Obj_t *pObj,int *pfCompl,int *pCounter)

{
  ulong *puVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  Vec_Wrd_t *p;
  word *pwVar5;
  ulong uVar6;
  Abc_Obj_t *pAVar7;
  word wVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  Abc_Obj_t *pObj0;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *local_68;
  uint *local_60;
  int *local_58;
  ulong local_50;
  Abc_Ntk_t *local_48;
  Abc_Obj_t *local_40;
  Abc_Obj_t *local_38;
  
  local_58 = pCounter;
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                  ,0x66,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
  }
  local_48 = pObj->pNtk;
  local_60 = (uint *)pfCompl;
  iVar4 = Abc_NodeIsExorType(pObj);
  if (iVar4 == 0) {
    __assert_fail("Abc_NodeIsExorType(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                  ,0x67,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
  }
  p = (Vec_Wrd_t *)malloc(0x10);
  p->nCap = 0x10;
  p->nSize = 0;
  pwVar5 = (word *)malloc(0x80);
  p->pArray = pwVar5;
  Vec_WrdPush(p,(ulong)(*(uint *)&pObj->field_0x14 >> 0xc) << 0x20 | (long)pObj->Id);
  uVar13 = p->nSize;
  uVar10 = 0;
  do {
    if ((int)uVar13 < 1) {
LAB_002c4387:
      *local_60 = uVar10;
      return p;
    }
    pwVar5 = p->pArray;
    uVar12 = (ulong)uVar13;
    uVar2 = uVar13;
    uVar3 = uVar12;
    if (1 < uVar13) {
      uVar6 = 1;
      wVar8 = *pwVar5;
      do {
        puVar1 = pwVar5 + uVar6;
        if (*puVar1 <= wVar8) {
          __assert_fail("Num < NumNext",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                        ,0x71,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
        }
        uVar6 = uVar6 + 1;
        wVar8 = *puVar1;
      } while (uVar12 != uVar6);
    }
    do {
      local_50 = uVar3;
      uVar12 = uVar12 - 1;
      uVar11 = uVar2 - 1;
      if (uVar13 <= uVar11) goto LAB_002c43bf;
      wVar8 = pwVar5[uVar12 & 0xffffffff];
      uVar9 = (uint)wVar8;
      if (((int)uVar9 < 0) || (local_48->vObjs->nSize <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      local_40 = (Abc_Obj_t *)local_48->vObjs->pArray[uVar9 & 0x7fffffff];
      iVar4 = Abc_NodeIsExorType(local_40);
      if (iVar4 != 0) {
        uVar9 = uVar13 - 1;
        uVar12 = 1;
        goto LAB_002c41ea;
      }
      bVar14 = 1 < (int)uVar2;
      uVar2 = uVar11;
      uVar3 = local_50;
    } while (bVar14);
LAB_002c422d:
    if (uVar11 == 0) {
      *local_60 = uVar10;
      if ((int)uVar13 < 1) {
        return p;
      }
      pwVar5 = p->pArray;
      uVar12 = 0;
      do {
        pwVar5[uVar12] = (long)(int)pwVar5[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
      return p;
    }
    pAVar7 = Abc_NodeRecognizeMux(local_40,&local_38,&local_68);
    if (local_38 != (Abc_Obj_t *)((ulong)local_68 ^ 1)) {
      __assert_fail("pObj1 == Abc_ObjNot(pObj0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                    ,0x82,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
    }
    uVar10 = uVar10 ^ ((uint)local_68 ^ (uint)pAVar7) & 1;
    local_68 = (Abc_Obj_t *)((ulong)local_68 & 0xfffffffffffffffe);
    Vec_WrdPushOrder(p,(ulong)(*(uint *)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x14) >> 0xc) <<
                       0x20 | (long)*(int *)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x10));
    Vec_WrdPushOrder(p,(ulong)(*(uint *)&local_68->field_0x14 >> 0xc) << 0x20 | (long)local_68->Id);
    *local_58 = *local_58 + 1;
    uVar2 = p->nSize;
    if ((int)uVar2 < 1) {
      if ((int)uVar2 < 0) {
LAB_002c445a:
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x276,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
      }
      p->nSize = 0;
      goto LAB_002c4387;
    }
    pwVar5 = p->pArray;
    uVar13 = 0;
    uVar12 = 0;
    do {
      uVar3 = pwVar5[uVar12];
      uVar11 = (int)uVar12 + 1;
      if (uVar11 == uVar2) {
        if (((int)uVar13 < 0) || (uVar2 <= uVar13)) {
LAB_002c441c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        uVar12 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
        pwVar5[uVar12] = uVar3;
        break;
      }
      if ((int)uVar2 <= (int)uVar11) {
LAB_002c43bf:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if (pwVar5[uVar11] < uVar3) {
        __assert_fail("Num <= NumNext",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                      ,0x92,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
      }
      if (uVar3 == pwVar5[uVar11]) {
        uVar11 = (int)uVar12 + 2;
      }
      else {
        if (((int)uVar13 < 0) || (uVar2 <= uVar13)) goto LAB_002c441c;
        uVar12 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
        pwVar5[uVar12] = uVar3;
      }
      uVar12 = (ulong)uVar11;
    } while ((int)uVar11 < (int)uVar2);
    if ((int)uVar2 < (int)uVar13) goto LAB_002c445a;
    p->nSize = uVar13;
  } while( true );
LAB_002c41ea:
  uVar11 = uVar2;
  if (pwVar5[uVar12 - 1] != wVar8) goto code_r0x002c41f1;
  if ((int)uVar12 < (int)uVar13) {
    uVar12 = uVar12 - 1;
    do {
      pwVar5[uVar12] = pwVar5[uVar12 + 1];
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  p->nSize = uVar9;
  uVar13 = uVar9;
  goto LAB_002c422d;
code_r0x002c41f1:
  bVar14 = uVar12 == local_50;
  uVar12 = uVar12 + 1;
  if (bVar14) goto LAB_002c422d;
  goto LAB_002c41ea;
}

Assistant:

Vec_Wrd_t * Abc_NtkShareSuperXor( Abc_Obj_t * pObj, int * pfCompl, int * pCounter )
{
    Abc_Ntk_t * pNtk = Abc_ObjNtk(pObj);
    Abc_Obj_t * pObjC, * pObj0, * pObj1, * pRoot = NULL;
    Vec_Wrd_t * vSuper;
    word Num, NumNext;
    int i, k, fCompl = 0;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( Abc_NodeIsExorType(pObj) );
    // start iteration
    vSuper = Vec_WrdAlloc( 10 );
    Vec_WrdPush( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObj), Abc_ObjId(pObj)) );
    while ( Vec_WrdSize(vSuper) > 0 )
    {
        // make sure there are no duplicates
        Num = Vec_WrdEntry( vSuper, 0 );
        Vec_WrdForEachEntryStart( vSuper, NumNext, i, 1 )
        {
            assert( Num < NumNext );
            Num = NumNext;
        }
        // extract XOR gate decomposable on the topmost level
        Vec_WrdForEachEntryReverse( vSuper, Num, i )
        {
            pRoot = Abc_NtkObj( pNtk, Abc_NtkShareUnpackId(Num) );
            if ( Abc_NodeIsExorType(pRoot) )
            {
                Vec_WrdRemove( vSuper, Num );
                break;
            }
        }
        if ( i == -1 )
            break;
        // extract
        pObjC = Abc_NodeRecognizeMux( pRoot, &pObj1, &pObj0 );
        assert( pObj1 == Abc_ObjNot(pObj0) );
        fCompl ^= Abc_ObjIsComplement(pObjC);  pObjC = Abc_ObjRegular(pObjC);
        fCompl ^= Abc_ObjIsComplement(pObj0);  pObj0 = Abc_ObjRegular(pObj0);
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObjC), Abc_ObjId(pObjC)) );
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObj0), Abc_ObjId(pObj0)) );
        (*pCounter)++;
        // remove duplicates
        k = 0;
        Vec_WrdForEachEntry( vSuper, Num, i )
        {
            if ( i + 1 == Vec_WrdSize(vSuper) )
            {
                Vec_WrdWriteEntry( vSuper, k++, Num );
                break;
            }
            NumNext = Vec_WrdEntry( vSuper, i+1 );
            assert( Num <= NumNext );
            if ( Num == NumNext )
                i++;
            else
                Vec_WrdWriteEntry( vSuper, k++, Num );
        }
        Vec_WrdShrink( vSuper, k );
    }
    *pfCompl = fCompl;
    Vec_WrdForEachEntry( vSuper, Num, i )
        Vec_WrdWriteEntry( vSuper, i, Abc_NtkShareUnpackId(Num) );
    return vSuper;
}